

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

cio_websocket_write_job * write_jobs_popfront(cio_websocket *websocket)

{
  cio_websocket_write_job *job_00;
  cio_websocket_write_job *job;
  cio_websocket *websocket_local;
  
  job_00 = dequeue_job(websocket);
  remove_websocket_header(job_00);
  job_00->wbh = (cio_write_buffer *)0x0;
  return job_00;
}

Assistant:

static inline const struct cio_websocket_write_job *write_jobs_popfront(struct cio_websocket *websocket)
{
	struct cio_websocket_write_job *job = dequeue_job(websocket);
	remove_websocket_header(job);
	job->wbh = NULL;

	return job;
}